

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase813::run(TestCase813 *this)

{
  ArrayPtr<const_kj::OwnFd> fds;
  int iVar1;
  __pid_t _Var2;
  undefined4 extraout_var;
  size_t sVar3;
  size_t extraout_RDX;
  long lVar4;
  OwnFd *this_00;
  ArrayPtr<const_unsigned_char> data;
  ssize_t n;
  Fault f;
  bool local_108;
  ReadResult result;
  OwnFd in2;
  OwnFd in1;
  char buffer [4];
  OwnFd in3;
  OwnFd out2;
  OwnFd out1;
  OwnFd local_d4;
  int pipeFds [2];
  char buffer_1 [4];
  CapabilityPipe capPipe;
  AsyncIoContext io;
  
  setupAsyncIo();
  (*(io.provider.ptr)->_vptr_AsyncIoProvider[2])(&capPipe);
  pipeFds[0] = 0;
  pipeFds[1] = 0;
  do {
    iVar1 = ::pipe(pipeFds);
    if (-1 < iVar1) goto LAB_001f30e9;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x33a,iVar1,"miniposix::pipe(pipeFds)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f30e9:
  in1.fd = pipeFds[0];
  out1.fd = pipeFds[1];
  do {
    iVar1 = ::pipe(pipeFds);
    if (-1 < iVar1) goto LAB_001f3121;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x33e,iVar1,"miniposix::pipe(pipeFds)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f3121:
  in2.fd = pipeFds[0];
  out2.fd = pipeFds[1];
  do {
    iVar1 = ::pipe(pipeFds);
    if (-1 < iVar1) goto LAB_001f3156;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x342,iVar1,"miniposix::pipe(pipeFds)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f3156:
  f.exception._0_4_ = out1.fd;
  f.exception._4_4_ = out2.fd;
  in3.fd = pipeFds[0];
  out1.fd = -1;
  out2.fd = -1;
  local_d4.fd = -1;
  fds.size_ = 3;
  fds.ptr = (OwnFd *)&f;
  data.size_ = (size_t)&kj::_::ByteLiteral<4ul>;
  data.ptr = (uchar *)capPipe.ends[0].ptr;
  AsyncCapabilityStream::writeWithFds
            ((AsyncCapabilityStream *)&result,data,
             (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>)ZEXT816(3),fds);
  Promise<void>::wait((Promise<void> *)&result,io.waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&result);
  lVar4 = 8;
  do {
    OwnFd::~OwnFd((OwnFd *)((long)&f.exception + lVar4));
    lVar4 = lVar4 + -4;
  } while (lVar4 != -4);
  n = -1;
  sVar3 = 3;
  (*((capPipe.ends[1].ptr)->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[0xf])
            (&f);
  _Var2 = Promise<kj::AsyncCapabilityStream::ReadResult>::wait
                    ((Promise<kj::AsyncCapabilityStream::ReadResult> *)&f,io.waitScope);
  result.byteCount = CONCAT44(extraout_var,_Var2);
  result.capCount = extraout_RDX;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
  f.exception = (Exception *)&result.capCount;
  if (result.capCount != 2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&>
              ((Fault *)buffer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x34f,FAILED,"result.capCount == 2","_kjCondition,",
               (DebugComparison<unsigned_long_&,_int> *)&f);
    kj::_::Debug::Fault::fatal((Fault *)buffer);
  }
  f.exception = (Exception *)&PTR__FdOutputStream_0059d2b0;
  FdOutputStream::write((FdOutputStream *)&f,0x3fb350,(void *)0x3,sVar3);
  FdOutputStream::~FdOutputStream((FdOutputStream *)&f);
  f.exception = (Exception *)&PTR__FdOutputStream_0059d2b0;
  FdOutputStream::write((FdOutputStream *)&f,0x3fb358,(void *)0x3,sVar3);
  FdOutputStream::~FdOutputStream((FdOutputStream *)&f);
  this_00 = (OwnFd *)((long)&n + 4);
  lVar4 = 0;
  do {
    OwnFd::~OwnFd(this_00);
    lVar4 = lVar4 + 4;
    this_00 = this_00 + -1;
  } while (lVar4 != 8);
  do {
    iVar1 = fcntl(in1.fd,4,0x800);
    if (-1 < iVar1) goto LAB_001f33dd;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x356,iVar1,"fcntl(in1, F_SETFL, O_NONBLOCK)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f33dd:
  do {
    iVar1 = fcntl(in2.fd,4,0x800);
    if (-1 < iVar1) goto LAB_001f3408;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x357,iVar1,"fcntl(in2, F_SETFL, O_NONBLOCK)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f3408:
  do {
    iVar1 = fcntl(in3.fd,4,0x800);
    if (-1 < iVar1) goto LAB_001f3433;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x358,iVar1,"fcntl(in3, F_SETFL, O_NONBLOCK)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f3433:
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  do {
    n = read(in1.fd,buffer,4);
    if (-1 < n) goto LAB_001f3475;
    iVar1 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x35e,iVar1,"n = read(in1, buffer, 4)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f3475:
  f.exception = (Exception *)&n;
  if (n != 3) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x35f,FAILED,"n == 3","_kjCondition,",(DebugComparison<long_&,_int> *)&f);
    kj::_::Debug::Fault::fatal((Fault *)&result);
  }
  buffer = (char  [4])((uint)buffer & 0xffffff);
  sVar3 = strlen(buffer);
  result.capCount = sVar3 + 1;
  result.byteCount = (size_t)buffer;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)&f,
             (DebugExpression<kj::StringPtr> *)&result,(char (*) [4])0x401abd);
  if (local_108 == false) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x361,FAILED,"kj::StringPtr(buffer) == \"bar\"","_kjCondition,",
               (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)&f);
    kj::_::Debug::Fault::fatal((Fault *)&result);
  }
  do {
    n = read(in1.fd,buffer,4);
    if (-1 < n) goto LAB_001f3521;
    iVar1 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x364,iVar1,"n = read(in1, buffer, 4)","");
    kj::_::Debug::Fault::fatal(&f);
  }
  if (n < 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x366,FAILED,(char *)0x0,"\"out1 was not closed\"",
               (char (*) [20])"out1 was not closed");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f3521:
  if (n != 0) {
    f.exception = (Exception *)&n;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x368,FAILED,"n == 0","_kjCondition,",(DebugComparison<long_&,_int> *)&f);
    kj::_::Debug::Fault::fatal((Fault *)&result);
  }
  f.exception = (Exception *)&n;
  do {
    n = read(in2.fd,buffer,4);
    if (-1 < n) goto LAB_001f3585;
    iVar1 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x36b,iVar1,"n = read(in2, buffer, 4)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f3585:
  if (n != 3) {
    f.exception = (Exception *)&n;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x36c,FAILED,"n == 3","_kjCondition,",(DebugComparison<long_&,_int> *)&f);
    kj::_::Debug::Fault::fatal((Fault *)&result);
  }
  buffer = (char  [4])((uint)buffer & 0xffffff);
  f.exception = (Exception *)&n;
  sVar3 = strlen(buffer);
  result.capCount = sVar3 + 1;
  result.byteCount = (size_t)buffer;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)&f,
             (DebugExpression<kj::StringPtr> *)&result,(char (*) [4])0x3f3548);
  if (local_108 == false) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x36e,FAILED,"kj::StringPtr(buffer) == \"baz\"","_kjCondition,",
               (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)&f);
    kj::_::Debug::Fault::fatal((Fault *)&result);
  }
  do {
    n = read(in2.fd,buffer,4);
    if (-1 < n) goto LAB_001f3631;
    iVar1 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x371,iVar1,"n = read(in2, buffer, 4)","");
    kj::_::Debug::Fault::fatal(&f);
  }
  if (n < 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x373,FAILED,(char *)0x0,"\"out2 was not closed\"",
               (char (*) [20])"out2 was not closed");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f3631:
  if (n != 0) {
    f.exception = (Exception *)&n;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x375,FAILED,"n == 0","_kjCondition,",(DebugComparison<long_&,_int> *)&f);
    kj::_::Debug::Fault::fatal((Fault *)&result);
  }
  f.exception = (Exception *)&n;
  do {
    n = read(in3.fd,buffer,4);
    if (-1 < n) goto LAB_001f369e;
    iVar1 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x378,iVar1,"n = read(in3, buffer, 4)","");
    kj::_::Debug::Fault::fatal(&f);
  }
  if (n < 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[422]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x37e,FAILED,(char *)0x0,
               "\"out3 was not closed. This could indicate that your operating system kernel is \" \"buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was \" \"known to do this until late 2018, while MacOS still has this bug as of this writing in \" \"2019. However, KJ works around the problem on those platforms. You need to enable the \" \"same work-around for your OS -- search for \'SCM_RIGHTS\' in src/kj/async-io-unix.c++.\""
               ,(char (*) [422])
                "out3 was not closed. This could indicate that your operating system kernel is buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was known to do this until late 2018, while MacOS still has this bug as of this writing in 2019. However, KJ works around the problem on those platforms. You need to enable the same work-around for your OS -- search for \'SCM_RIGHTS\' in src/kj/async-io-unix.c++."
              );
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001f369e:
  if (n != 0) {
    f.exception = (Exception *)&n;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x380,FAILED,"n == 0","_kjCondition,",(DebugComparison<long_&,_int> *)&f);
    kj::_::Debug::Fault::fatal((Fault *)&result);
  }
  f.exception = (Exception *)&n;
  OwnFd::~OwnFd(&local_d4);
  OwnFd::~OwnFd(&in3);
  OwnFd::~OwnFd(&out2);
  OwnFd::~OwnFd(&in2);
  OwnFd::~OwnFd(&out1);
  OwnFd::~OwnFd(&in1);
  CapabilityPipe::~CapabilityPipe(&capPipe);
  AsyncIoContext::~AsyncIoContext(&io);
  return;
}

Assistant:

TEST(AsyncIo, ScmRightsTruncatedEven) {
  // Test that if we send three FDs over a unix socket, but the receiving end only receives two, we
  // don't leak the third FD. This is different from the send-two-receive-one case in that
  // CMSG_SPACE() on many systems rounds up such that there is always space for an even number of
  // FDs. In that case the other test only verifies that our userspace code to close unwanted FDs
  // is correct, whereas *this* test really verifies that the *kernel* properly closes truncated
  // FDs.

  auto io = setupAsyncIo();

  auto capPipe = io.provider->newCapabilityPipe();

  int pipeFds[2]{};
  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in1(pipeFds[0]);
  kj::OwnFd out1(pipeFds[1]);

  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in2(pipeFds[0]);
  kj::OwnFd out2(pipeFds[1]);

  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in3(pipeFds[0]);
  kj::OwnFd out3(pipeFds[1]);

  {
    OwnFd sendFds[3] = { kj::mv(out1), kj::mv(out2), kj::mv(out3) };
    capPipe.ends[0]->writeWithFds("foo"_kjb, nullptr, sendFds).wait(io.waitScope);
  }

  {
    char buffer[4]{};
    OwnFd fdBuffer[2];
    auto result = capPipe.ends[1]->tryReadWithFds(buffer, 3, 3, fdBuffer, 2).wait(io.waitScope);
    KJ_ASSERT(result.capCount == 2);
    kj::FdOutputStream(fdBuffer[0].get()).write("bar"_kjb);
    kj::FdOutputStream(fdBuffer[1].get()).write("baz"_kjb);
  }

  // We want to carefully verify that out1, out2, and out3 were closed, without deadlocking if they
  // weren't. So we manually set nonblocking mode and then issue read()s.
  KJ_SYSCALL(fcntl(in1, F_SETFL, O_NONBLOCK));
  KJ_SYSCALL(fcntl(in2, F_SETFL, O_NONBLOCK));
  KJ_SYSCALL(fcntl(in3, F_SETFL, O_NONBLOCK));

  char buffer[4]{};
  ssize_t n;

  // First we read "bar" from in1.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  KJ_ASSERT(n == 3);
  buffer[3] = '\0';
  KJ_ASSERT(kj::StringPtr(buffer) == "bar");

  // Now it should be EOF.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out1 was not closed");
  }
  KJ_ASSERT(n == 0);

  // Next we read "baz" from in2.
  KJ_NONBLOCKING_SYSCALL(n = read(in2, buffer, 4));
  KJ_ASSERT(n == 3);
  buffer[3] = '\0';
  KJ_ASSERT(kj::StringPtr(buffer) == "baz");

  // Now it should be EOF.
  KJ_NONBLOCKING_SYSCALL(n = read(in2, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out2 was not closed");
  }
  KJ_ASSERT(n == 0);

  // Third pipe should have been closed implicitly because we didn't provide space to receive it.
  KJ_NONBLOCKING_SYSCALL(n = read(in3, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out3 was not closed. This could indicate that your operating system kernel is "
        "buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was "
        "known to do this until late 2018, while MacOS still has this bug as of this writing in "
        "2019. However, KJ works around the problem on those platforms. You need to enable the "
        "same work-around for your OS -- search for 'SCM_RIGHTS' in src/kj/async-io-unix.c++.");
  }
  KJ_ASSERT(n == 0);
}